

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlCtxtResetPush(xmlParserCtxtPtr ctxt,char *chunk,int size,char *filename,char *encoding)

{
  int iVar1;
  xmlParserInputPtr value;
  xmlParserInputPtr input;
  char *encoding_local;
  char *filename_local;
  int size_local;
  char *chunk_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = 1;
  }
  else {
    xmlCtxtReset(ctxt);
    value = xmlNewPushInput(filename,chunk,size);
    if (value == (xmlParserInputPtr)0x0) {
      ctxt_local._4_4_ = 1;
    }
    else {
      iVar1 = xmlCtxtPushInput(ctxt,value);
      if (iVar1 < 0) {
        xmlFreeInputStream(value);
        ctxt_local._4_4_ = 1;
      }
      else {
        if (encoding != (char *)0x0) {
          xmlSwitchEncodingName(ctxt,encoding);
        }
        ctxt_local._4_4_ = 0;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlCtxtResetPush(xmlParserCtxtPtr ctxt, const char *chunk,
                 int size, const char *filename, const char *encoding)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return(1);

    xmlCtxtReset(ctxt);

    input = xmlNewPushInput(filename, chunk, size);
    if (input == NULL)
        return(1);

    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        return(1);
    }

    if (encoding != NULL)
        xmlSwitchEncodingName(ctxt, encoding);

    return(0);
}